

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * __thiscall google::protobuf::FastInt32ToBufferLeft(protobuf *this,int32 i,char *buffer)

{
  char *pcVar1;
  undefined4 in_register_00000034;
  uint local_1c;
  undefined1 *puStack_18;
  uint32 u;
  char *buffer_local;
  int32 i_local;
  
  puStack_18 = (undefined1 *)CONCAT44(in_register_00000034,i);
  local_1c = (uint)this;
  if ((int)local_1c < 0) {
    *puStack_18 = 0x2d;
    local_1c = -local_1c;
    puStack_18 = puStack_18 + 1;
  }
  pcVar1 = FastUInt32ToBufferLeft((protobuf *)(ulong)local_1c,(uint32)puStack_18,buffer);
  return pcVar1;
}

Assistant:

char* FastInt32ToBufferLeft(int32 i, char* buffer) {
  uint32 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt32ToBufferLeft(u, buffer);
}